

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cc
# Opt level: O3

void __thiscall SDL2pp::Exception::Exception(Exception *this,char *function)

{
  char *pcVar1;
  char *in_RCX;
  string local_38;
  
  pcVar1 = (char *)SDL_GetError();
  make_what_abi_cxx11_(&local_38,(Exception *)function,pcVar1,in_RCX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__Exception_0010fd48;
  std::__cxx11::string::string((string *)&this->sdl_function_,function,(allocator *)&local_38);
  pcVar1 = (char *)SDL_GetError();
  std::__cxx11::string::string((string *)&this->sdl_error_,pcVar1,(allocator *)&local_38);
  return;
}

Assistant:

Exception::Exception(const char* function)
	: std::runtime_error(make_what(function, SDL_GetError())),
	  sdl_function_(function),
	  sdl_error_(SDL_GetError()) {
}